

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

uint AttrIndent(TidyDocImpl *doc,Node *node,AttVal *attr)

{
  Bool BVar1;
  uint uVar2;
  Node *pNVar3;
  Node *local_40;
  uint xtra;
  uint spaces;
  AttVal *attr_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  doc_local._4_4_ = (uint)(doc->config).value[0x26].v;
  if (node->element != (tmbstr)0x0) {
    BVar1 = prvTidynodeHasCM(node,0x10);
    if (BVar1 != no) {
      local_40 = node;
      if (node->parent != (Node *)0x0) {
        local_40 = node->parent;
      }
      BVar1 = ShouldIndent(doc,local_40);
      if (BVar1 != no) {
        pNVar3 = prvTidyFindContainer(node);
        if (pNVar3 == (Node *)0x0) {
          return doc_local._4_4_;
        }
        uVar2 = prvTidytmbstrlen(pNVar3->element);
        return uVar2 + 2;
      }
    }
    uVar2 = prvTidytmbstrlen(node->element);
    doc_local._4_4_ = uVar2 + 2;
  }
  return doc_local._4_4_;
}

Assistant:

static uint AttrIndent( TidyDocImpl* doc, Node* node, AttVal* ARG_UNUSED(attr) )
{
  uint spaces = cfg( doc, TidyIndentSpaces );
  uint xtra = 2;  /* 1 for the '<', another for the ' ' */
  if ( node->element == NULL )
    return spaces;

  if ( !TY_(nodeHasCM)(node, CM_INLINE) ||
       !ShouldIndent(doc, node->parent ? node->parent: node) )
    return xtra + TY_(tmbstrlen)( node->element );

  if ( NULL != (node = TY_(FindContainer)(node)) )
    return xtra + TY_(tmbstrlen)( node->element );
  return spaces;
}